

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ListColumnData::GetColumnSegmentInfo
          (ListColumnData *this,idx_t row_group_index,vector<unsigned_long,_true> *col_path,
          vector<duckdb::ColumnSegmentInfo,_true> *result)

{
  reference pvVar1;
  pointer pCVar2;
  unsigned_long local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnData::GetColumnSegmentInfo
            (&this->super_ColumnData,row_group_index,(vector<unsigned_long,_true> *)&local_48,result
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  local_80 = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,&local_80);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnData::GetColumnSegmentInfo
            (&(this->validity).super_ColumnData,row_group_index,
             (vector<unsigned_long,_true> *)&local_60,result);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
  pvVar1 = vector<unsigned_long,_true>::back(col_path);
  *pvVar1 = 1;
  pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             &col_path->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  (*pCVar2->_vptr_ColumnData[0x21])(pCVar2,row_group_index,&local_78,result);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void ListColumnData::GetColumnSegmentInfo(duckdb::idx_t row_group_index, vector<duckdb::idx_t> col_path,
                                          vector<duckdb::ColumnSegmentInfo> &result) {
	ColumnData::GetColumnSegmentInfo(row_group_index, col_path, result);
	col_path.push_back(0);
	validity.GetColumnSegmentInfo(row_group_index, col_path, result);
	col_path.back() = 1;
	child_column->GetColumnSegmentInfo(row_group_index, col_path, result);
}